

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<TestResult_(mp::CallExpr)>::FunctionMockerBase
          (FunctionMockerBase<TestResult_(mp::CallExpr)> *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001c9ab0;
  (this->current_spec_).function_mocker_ = this;
  (this->current_spec_).matchers_.super__Tuple_impl<0UL,_testing::Matcher<mp::CallExpr>_>.
  super__Head_base<0UL,_testing::Matcher<mp::CallExpr>,_false>._M_head_impl.
  super_MatcherBase<mp::CallExpr>.impl_.value_ = (MatcherInterface<mp::CallExpr> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->current_spec_).matchers_.super__Tuple_impl<0UL,_testing::Matcher<mp::CallExpr>_>.
          super__Head_base<0UL,_testing::Matcher<mp::CallExpr>,_false>._M_head_impl.
          super_MatcherBase<mp::CallExpr>.impl_ + 8))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->current_spec_).matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::CallExpr>_>.
               super__Head_base<0UL,_testing::Matcher<mp::CallExpr>,_false>._M_head_impl.
               super_MatcherBase<mp::CallExpr>.impl_ + 8);
  (this->current_spec_).matchers_.super__Tuple_impl<0UL,_testing::Matcher<mp::CallExpr>_>.
  super__Head_base<0UL,_testing::Matcher<mp::CallExpr>,_false>._M_head_impl.
  super_MatcherBase<mp::CallExpr>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001c9b00;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}